

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

int cuddBddLICMarkEdges(DdManager *dd,DdNode *f,DdNode *c,st__table *table,st__table *cache)

{
  int iVar1;
  char *key_00;
  uint local_9c;
  MarkCacheKey *key;
  char **slot;
  uint local_80;
  int retval;
  int res;
  int resE;
  int resT;
  int comple;
  uint topc;
  uint topf;
  DdNode *zero;
  DdNode *one;
  DdNode *Cnv;
  DdNode *Cv;
  DdNode *Fnv;
  DdNode *Fv;
  st__table *cache_local;
  st__table *table_local;
  DdNode *c_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  zero = dd->one;
  _topc = (DdNode *)((ulong)zero ^ 1);
  if (c == _topc) {
    dd_local._4_4_ = 0;
  }
  else if (f == zero) {
    dd_local._4_4_ = 1;
  }
  else if (f == _topc) {
    dd_local._4_4_ = 2;
  }
  else {
    resE = (uint)f & 1;
    c_local = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    Fv = (DdNode *)cache;
    cache_local = table;
    table_local = (st__table *)c;
    f_local = &dd->sentinel;
    key_00 = (char *)malloc(0x10);
    if (key_00 == (char *)0x0) {
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local._4_4_ = 0xffffffff;
    }
    else {
      *(DdNode **)key_00 = c_local;
      *(st__table **)(key_00 + 8) = table_local;
      iVar1 = st__lookup_int((st__table *)Fv,key_00,(int *)&local_80);
      if (iVar1 == 0) {
        comple = *(uint *)(f_local[7].Id + (ulong)c_local->index * 4);
        if (*(int *)((ulong)table_local & 0xfffffffffffffffe) == 0x7fffffff) {
          local_9c = *(uint *)((ulong)table_local & 0xfffffffffffffffe);
        }
        else {
          local_9c = *(uint *)(f_local[7].Id +
                              (ulong)*(uint *)((ulong)table_local & 0xfffffffffffffffe) * 4);
        }
        resT = local_9c;
        if (local_9c < (uint)comple) {
          Cv = c_local;
          Fnv = c_local;
        }
        else {
          Fnv = (c_local->type).kids.T;
          Cv = (c_local->type).kids.E;
        }
        if ((uint)comple < local_9c) {
          one = (DdNode *)table_local;
          Cnv = (DdNode *)table_local;
        }
        else {
          Cnv = *(DdNode **)(((ulong)table_local & 0xfffffffffffffffe) + 0x10);
          one = *(DdNode **)(((ulong)table_local & 0xfffffffffffffffe) + 0x18);
          if (((ulong)table_local & 1) != 0) {
            Cnv = (DdNode *)((ulong)Cnv ^ 1);
            one = (DdNode *)((ulong)one ^ 1);
          }
        }
        res = cuddBddLICMarkEdges((DdManager *)f_local,Fnv,Cnv,cache_local,(st__table *)Fv);
        if (res == -1) {
          if (key_00 != (char *)0x0) {
            free(key_00);
          }
          dd_local._4_4_ = 0xffffffff;
        }
        else {
          retval = cuddBddLICMarkEdges((DdManager *)f_local,Cv,one,cache_local,(st__table *)Fv);
          if (retval == -1) {
            if (key_00 != (char *)0x0) {
              free(key_00);
            }
            dd_local._4_4_ = 0xffffffff;
          }
          else {
            if ((uint)comple <= (uint)resT) {
              slot._4_4_ = st__find_or_add(cache_local,(char *)c_local,(char ***)&key);
              if (slot._4_4_ == 0) {
                key->f = (DdNode *)(long)(res << 2 | retval);
              }
              else {
                if (slot._4_4_ != 1) {
                  if (key_00 != (char *)0x0) {
                    free(key_00);
                  }
                  return -1;
                }
                key->f = (DdNode *)(long)(int)((uint)key->f | res << 2 | retval);
              }
            }
            local_80 = res | retval;
            iVar1 = st__insert((st__table *)Fv,key_00,(char *)(long)(int)local_80);
            if (iVar1 == -10000) {
              if (key_00 != (char *)0x0) {
                free(key_00);
              }
              dd_local._4_4_ = 0xffffffff;
            }
            else {
              if (resE != 0) {
                if (local_80 == 2) {
                  local_80 = 1;
                }
                else if (local_80 == 1) {
                  local_80 = 2;
                }
              }
              dd_local._4_4_ = local_80;
            }
          }
        }
      }
      else {
        if (key_00 != (char *)0x0) {
          free(key_00);
        }
        if (resE != 0) {
          if (local_80 == 2) {
            local_80 = 1;
          }
          else if (local_80 == 1) {
            local_80 = 2;
          }
        }
        dd_local._4_4_ = local_80;
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

static int
cuddBddLICMarkEdges(
  DdManager * dd,
  DdNode * f,
  DdNode * c,
  st__table * table,
  st__table * cache)
{
    DdNode *Fv, *Fnv, *Cv, *Cnv;
    DdNode *one, *zero;
    unsigned int topf, topc;
    int comple;
    int resT, resE, res, retval;
    char **slot;
    MarkCacheKey *key;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (c == zero) return(DD_LIC_DC);
    if (f == one)  return(DD_LIC_1);
    if (f == zero) return(DD_LIC_0);

    /* Make canonical to increase the utilization of the cache. */
    comple = Cudd_IsComplement(f);
    f = Cudd_Regular(f);
    /* Now f is a regular pointer to a non-constant node; c may be
    ** constant, or it may be complemented.
    */

    /* Check the cache. */
    key = ABC_ALLOC(MarkCacheKey, 1);
    if (key == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    key->f = f; key->c = c;
    if ( st__lookup_int(cache, (char *)key, &res)) {
        ABC_FREE(key);
        if (comple) {
            if (res == DD_LIC_0) res = DD_LIC_1;
            else if (res == DD_LIC_1) res = DD_LIC_0;
        }
        return(res);
    }

    /* Recursive step. */
    topf = dd->perm[f->index];
    topc = cuddI(dd,Cudd_Regular(c)->index);
    if (topf <= topc) {
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topc <= topf) {
        /* We know that c is not constant because f is not. */
        Cv = cuddT(Cudd_Regular(c)); Cnv = cuddE(Cudd_Regular(c));
        if (Cudd_IsComplement(c)) {
            Cv = Cudd_Not(Cv);
            Cnv = Cudd_Not(Cnv);
        }
    } else {
        Cv = Cnv = c;
    }

    resT = cuddBddLICMarkEdges(dd, Fv, Cv, table, cache);
    if (resT == CUDD_OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }
    resE = cuddBddLICMarkEdges(dd, Fnv, Cnv, table, cache);
    if (resE == CUDD_OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }

    /* Update edge markings. */
    if (topf <= topc) {
        retval = st__find_or_add(table, (char *)f, (char ***)&slot);
        if (retval == 0) {
            *slot = (char *) (ptrint)((resT << 2) | resE);
        } else if (retval == 1) {
            *slot = (char *) (ptrint)((int)((ptrint) *slot) | (resT << 2) | resE);
        } else {
            ABC_FREE(key);
            return(CUDD_OUT_OF_MEM);
        }
    }

    /* Cache result. */
    res = resT | resE;
    if ( st__insert(cache, (char *)key, (char *)(ptrint)res) == st__OUT_OF_MEM) {
        ABC_FREE(key);
        return(CUDD_OUT_OF_MEM);
    }

    /* Take into account possible complementation. */
    if (comple) {
        if (res == DD_LIC_0) res = DD_LIC_1;
        else if (res == DD_LIC_1) res = DD_LIC_0;
    }
    return(res);

}